

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

str __thiscall
pybind11::str::format<pybind11::object&,pybind11::handle_const&>
          (str *this,object *args,handle *args_1)

{
  str_attr_accessor local_50;
  object local_30 [2];
  handle *args_local_1;
  object *args_local;
  str *this_local;
  
  args_local_1 = args_1;
  args_local = args;
  this_local = this;
  detail::object_api<pybind11::handle>::attr
            (&local_50,(object_api<pybind11::handle> *)args,"format");
  detail::object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)local_30,(object *)&local_50,args_local_1);
  str(this,local_30);
  pybind11::object::~object(local_30);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_50);
  return (object)(object)this;
}

Assistant:

str format(Args &&...args) const {
        return attr("format")(std::forward<Args>(args)...);
    }